

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  xmlChar xVar3;
  xmlParserInputPtr pxVar4;
  __int32_t *p_Var5;
  byte *pbVar6;
  internalSubsetSAXFunc p_Var7;
  xmlChar *pxVar8;
  __int32_t **pp_Var9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  
  pxVar4 = ctxt->input;
  ppxVar1 = &pxVar4->cur;
  *ppxVar1 = *ppxVar1 + 9;
  piVar2 = &pxVar4->col;
  *piVar2 = *piVar2 + 9;
  htmlSkipBlankChars(ctxt);
  pxVar8 = htmlParseName(ctxt);
  if (pxVar8 == (xmlChar *)0x0) {
    htmlParseErr(ctxt,XML_ERR_NAME_REQUIRED,"htmlParseDocTypeDecl : no DOCTYPE name !\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
  }
  htmlSkipBlankChars(ctxt);
  pp_Var9 = __ctype_toupper_loc();
  p_Var5 = *pp_Var9;
  pxVar4 = ctxt->input;
  pbVar6 = pxVar4->cur;
  if (p_Var5[*pbVar6] == 0x50) {
    if ((((p_Var5[pbVar6[1]] != 0x55) || (p_Var5[pbVar6[2]] != 0x42)) || (p_Var5[pbVar6[3]] != 0x4c)
        ) || ((p_Var5[pbVar6[4]] != 0x49 || (p_Var5[pbVar6[5]] != 0x43)))) goto LAB_0014d32f;
    pxVar4->cur = pbVar6 + 6;
    pxVar4->col = pxVar4->col + 6;
    if ((0x20 < (ulong)pbVar6[6]) || ((0x100002600U >> ((ulong)pbVar6[6] & 0x3f) & 1) == 0)) {
      htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'PUBLIC\'\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    pxVar11 = htmlParsePubidLiteral(ctxt);
    if (pxVar11 == (xmlChar *)0x0) {
      htmlParseErr(ctxt,XML_ERR_PUBID_REQUIRED,"htmlParseExternalID: PUBLIC, no Public Identifier\n"
                   ,(xmlChar *)0x0,(xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    xVar3 = *ctxt->input->cur;
    if ((xVar3 == '\'') || (xVar3 == '\"')) {
      pxVar10 = htmlParseSystemLiteral(ctxt);
      goto LAB_0014d335;
    }
  }
  else if ((((p_Var5[*pbVar6] == 0x53) && (p_Var5[pbVar6[1]] == 0x59)) &&
           (p_Var5[pbVar6[2]] == 0x53)) &&
          (((p_Var5[pbVar6[3]] == 0x54 && (p_Var5[pbVar6[4]] == 0x45)) &&
           (p_Var5[pbVar6[5]] == 0x4d)))) {
    pxVar4->cur = pbVar6 + 6;
    pxVar4->col = pxVar4->col + 6;
    if ((0x20 < (ulong)pbVar6[6]) || ((0x100002600U >> ((ulong)pbVar6[6] & 0x3f) & 1) == 0)) {
      htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'SYSTEM\'\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
    }
    htmlSkipBlankChars(ctxt);
    pxVar10 = htmlParseSystemLiteral(ctxt);
    if (pxVar10 != (xmlChar *)0x0) {
      pxVar11 = (xmlChar *)0x0;
      goto LAB_0014d335;
    }
    pxVar11 = (xmlChar *)0x0;
    htmlParseErr(ctxt,XML_ERR_URI_REQUIRED,"htmlParseExternalID: SYSTEM, no URI\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
LAB_0014d32f:
    pxVar11 = (xmlChar *)0x0;
  }
  pxVar10 = (xmlChar *)0x0;
LAB_0014d335:
  htmlSkipBlankChars(ctxt);
  if (*ctxt->input->cur == '>') {
LAB_0014d34a:
    xmlNextChar(ctxt);
  }
  else {
    htmlParseErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,"DOCTYPE improperly terminated\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    while (xVar3 = *ctxt->input->cur, xVar3 != '\0') {
      if (xVar3 == '>') goto LAB_0014d34a;
      xmlNextChar(ctxt);
    }
  }
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var7 = ctxt->sax->internalSubset, p_Var7 != (internalSubsetSAXFunc)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var7)(ctxt->userData,pxVar8,pxVar11,pxVar10);
  }
  if (pxVar10 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar10);
  }
  if (pxVar11 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar11);
    return;
  }
  return;
}

Assistant:

static void
htmlParseDocTypeDecl(htmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP(9);

    SKIP_BLANKS;

    /*
     * Parse the DOCTYPE name.
     */
    name = htmlParseName(ctxt);
    if (name == NULL) {
	htmlParseErr(ctxt, XML_ERR_NAME_REQUIRED,
	             "htmlParseDocTypeDecl : no DOCTYPE name !\n",
		     NULL, NULL);
    }
    /*
     * Check that upper(name) == "HTML" !!!!!!!!!!!!!
     */

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = htmlParseExternalID(ctxt, &ExternalID);
    SKIP_BLANKS;

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (CUR != '>') {
	htmlParseErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED,
	             "DOCTYPE improperly terminated\n", NULL, NULL);
        /* Ignore bogus content */
        while ((CUR != 0) && (CUR != '>'))
            NEXT;
    }
    if (CUR == '>')
        NEXT;

    /*
     * Create or update the document accordingly to the DOCTYPE
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);

    /*
     * Cleanup, since we don't use all those identifiers
     */
    if (URI != NULL) xmlFree(URI);
    if (ExternalID != NULL) xmlFree(ExternalID);
}